

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O0

void __thiscall
lume::Neighborhoods::refresh
          (Neighborhoods *this,SPMesh *mesh,GrobSet grobTypes,Neighborhoods *grobConnections)

{
  element_type *mesh_00;
  ProfileMark local_29;
  Neighborhoods *pNStack_28;
  ProfileMark peproMark_Neighborhoods__refresh;
  Neighborhoods *grobConnections_local;
  SPMesh *mesh_local;
  Neighborhoods *this_local;
  GrobSet grobTypes_local;
  
  pNStack_28 = grobConnections;
  pepro::impl::ProfileMark::ProfileMark(&local_29,"Neighborhoods__refresh");
  std::shared_ptr<lume::Mesh>::operator=(&this->m_mesh,mesh);
  (this->m_centerGrobTypes).m_offset = grobTypes.m_offset;
  (this->m_neighborGrobTypes).m_offset = grobTypes.m_offset;
  ArrayAnnex<unsigned_int>::set_tuple_size(&this->m_nbrs,2);
  mesh_00 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_mesh);
  impl::FillNeighborMap<lume::ArrayAnnex<unsigned_int>>
            (&this->m_nbrs,&this->m_offsets,this->m_grobBaseInds,mesh_00,grobTypes,pNStack_28);
  pepro::impl::ProfileMark::~ProfileMark(&local_29);
  return;
}

Assistant:

void Neighborhoods::
refresh (SPMesh mesh, GrobSet grobTypes, const Neighborhoods& grobConnections)
{
	PEPRO_BEGIN(Neighborhoods__refresh);

	m_mesh = mesh;
	m_centerGrobTypes = grobTypes;
	m_neighborGrobTypes = grobTypes;

	m_nbrs.set_tuple_size (2);
	impl::FillNeighborMap (m_nbrs, m_offsets, m_grobBaseInds, *m_mesh,
	                       grobTypes, grobConnections);
}